

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glcBlendEquationAdvancedTests.cpp
# Opt level: O1

IterateResult __thiscall
glcts::CoherentBlendTestCaseGroup::CoherentBlendTest::iterate(CoherentBlendTest *this)

{
  GLfloat GVar1;
  GLfloat GVar2;
  GLfloat GVar3;
  GLfloat GVar4;
  byte bVar5;
  byte bVar6;
  byte bVar7;
  pointer log;
  ContextInfo *pCVar8;
  RenderContext *renderCtx;
  BlendStep *pBVar9;
  glUniform4fFunc p_Var10;
  uint uVar11;
  undefined4 uVar12;
  bool bVar13;
  int iVar14;
  int iVar15;
  GLenum GVar16;
  GLint GVar17;
  uint uVar18;
  uint uVar19;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  _Var21;
  char *pcVar22;
  ulong uVar23;
  byte *pbVar24;
  ostream *poVar25;
  TestError *this_00;
  uint uVar26;
  uint uVar27;
  CoherentBlendTest *pCVar28;
  GLSLVersion glslVersion;
  uint uVar29;
  long lVar30;
  uint uVar31;
  uint uVar32;
  char cVar33;
  char cVar34;
  int iVar35;
  int iVar36;
  char cVar37;
  char *extensionDirective;
  char cVar38;
  uint uVar39;
  uint uVar40;
  long lVar41;
  uint uVar42;
  uint uVar43;
  bool bVar44;
  Vec4 srcCol;
  Vec4 refCol;
  VertexArrayBinding posBinding;
  string frgSrc;
  FBOSentry fbo;
  ProgramSources sources;
  ShaderProgram p;
  uint local_39c;
  allocator<char> local_38a;
  allocator<char> local_389;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_388;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_380;
  ulong local_378;
  CoherentBlendTest *local_370;
  undefined1 local_368 [8];
  GLfloat local_360;
  GLfloat GStack_35c;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_358;
  undefined8 local_348;
  undefined8 uStack_340;
  long local_338;
  pointer local_330;
  value_type local_328;
  undefined1 local_308 [8];
  _Alloc_hider local_300;
  undefined1 local_2f8 [24];
  int local_2e0;
  VertexArrayPointer local_2d8;
  string local_2b8;
  FBOSentry local_298;
  undefined1 local_280 [8];
  undefined1 local_278 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_268 [3];
  ios_base local_208 [24];
  vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_> local_1f0;
  undefined1 local_1d0 [208];
  ShaderProgram local_100;
  Functions *pFVar20;
  
  iVar14 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[4])();
  iVar15 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  pFVar20 = (Functions *)CONCAT44(extraout_var_00,iVar15);
  log = (pointer)((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  local_280 = (undefined1  [8])0x1bc3b9e;
  pCVar8 = ((this->super_TestCase).m_context)->m_contextInfo;
  _Var21 = std::
           __find_if<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_equals_val<char_const*const>>
                     ((pCVar8->m_extensions).
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (pCVar8->m_extensions).
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish);
  if (_Var21._M_current ==
      (pCVar8->m_extensions).
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    tcu::TestContext::setTestResult
              ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,
               QP_TEST_RESULT_NOT_SUPPORTED,"GL_KHR_blend_equation_advanced");
  }
  else {
    local_280 = (undefined1  [8])0x1bc3bbd;
    pCVar8 = ((this->super_TestCase).m_context)->m_contextInfo;
    local_388 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                std::
                __find_if<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_equals_val<char_const*const>>
                          ((pCVar8->m_extensions).
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start,
                           (pCVar8->m_extensions).
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish);
    local_380 = (pCVar8->m_extensions).
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish;
    local_348 = (pointer)0x0;
    uStack_340 = 0;
    extensionDirective = (char *)0x0;
    local_298.m_gl = pFVar20;
    FBOSentry::init(&local_298,(EVP_PKEY_CTX *)0x400);
    pcVar22 = glu::getGLSLVersionDeclaration(this->m_glslVersion);
    GetSolidShader_abi_cxx11_
              (&local_2b8,(glcts *)"blend_support_all_equations",pcVar22,
               "#extension GL_KHR_blend_equation_advanced : require",extensionDirective);
    renderCtx = ((this->super_TestCase).m_context)->m_renderCtx;
    local_370 = this;
    GetDef2DVtxSrc_abi_cxx11_((string *)local_368,(glcts *)(ulong)this->m_glslVersion,glslVersion);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_308,(char *)local_368,&local_389);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_328,local_2b8._M_dataplus._M_p,&local_38a);
    local_1d0[0x10] = 0;
    local_1d0._17_8_ = 0;
    local_1d0._0_8_ = (pointer)0x0;
    local_1d0[8] = 0;
    local_1d0._9_7_ = 0;
    memset((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_280,0,0xac);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_280,(value_type *)local_308);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_268,&local_328);
    glu::ShaderProgram::ShaderProgram(&local_100,renderCtx,(ProgramSources *)local_280);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_1d0);
    std::vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_>::~vector
              (&local_1f0);
    lVar30 = 0x78;
    do {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)(local_280 + lVar30));
      lVar30 = lVar30 + -0x18;
    } while (lVar30 != -0x18);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_328._M_dataplus._M_p != &local_328.field_2) {
      operator_delete(local_328._M_dataplus._M_p,local_328.field_2._M_allocated_capacity + 1);
    }
    pCVar28 = local_370;
    if ((undefined1 *)CONCAT44(local_308._4_4_,local_308._0_4_) != local_2f8) {
      operator_delete((undefined1 *)CONCAT44(local_308._4_4_,local_308._0_4_),local_2f8._0_8_ + 1);
    }
    if (local_368 != (undefined1  [8])&local_358) {
      operator_delete((void *)local_368,local_358._M_allocated_capacity + 1);
    }
    if (local_100.m_program.m_info.linkOk == false) {
      glu::operator<<((TestLog *)log,&local_100);
      this_00 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (this_00,"Compile failed",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/common/glcBlendEquationAdvancedTests.cpp"
                 ,0x2a7);
      __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
    }
    (*pFVar20->useProgram)(local_100.m_program.m_program);
    GVar16 = (*pFVar20->getError)();
    glu::checkError(GVar16,"Program failed",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/common/glcBlendEquationAdvancedTests.cpp"
                    ,0x2aa);
    local_368 = (undefined1  [8])&local_358;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_368,"aPos","");
    local_280._0_4_ = 1;
    local_278._0_8_ = local_268;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_278,local_368,
               (char *)((long)local_368 + CONCAT44(GStack_35c,local_360)));
    local_268[0].field_2._M_allocated_capacity._0_4_ = 0;
    local_308._0_4_ = local_280._0_4_;
    local_300._M_p = local_2f8 + 8;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_300,local_278._0_8_,
               (undefined1 *)
               ((long)&((_Alloc_hider *)local_278._8_8_)->_M_p +
               (long)&((_Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)local_278._0_8_)->_M_impl));
    local_2e0 = (undefined4)local_268[0].field_2._M_allocated_capacity;
    local_2d8.componentType = VTX_COMP_FLOAT;
    local_2d8.convert = VTX_COMP_CONVERT_NONE;
    local_2d8.numComponents = 2;
    local_2d8.numElements = 4;
    local_2d8.stride = 0;
    local_2d8.data = s_pos;
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_278._0_8_ !=
        local_268) {
      operator_delete((void *)local_278._0_8_,(ulong)(local_268[0]._M_dataplus._M_p + 1));
    }
    if (local_368 != (undefined1  [8])&local_358) {
      operator_delete((void *)local_368,local_358._M_allocated_capacity + 1);
    }
    local_338 = CONCAT44(extraout_var,iVar14);
    local_330 = log;
    (*pFVar20->disable)(0xbd0);
    (*pFVar20->enable)(0xbe2);
    (*pFVar20->clearColor)((GLfloat)local_348,local_348._4_4_,(GLfloat)uStack_340,uStack_340._4_4_);
    (*pFVar20->clear)(0x4000);
    if (local_388 == local_380) {
      (*pFVar20->blendBarrier)();
    }
    if (0 < pCVar28->m_repeatCount) {
      uVar23 = 0;
      do {
        local_378 = uVar23;
        if (0 < pCVar28->m_numSteps) {
          lVar30 = 0;
          lVar41 = 0;
          do {
            pBVar9 = pCVar28->m_steps;
            GVar1 = *(GLfloat *)((long)pBVar9->src + lVar30);
            GVar2 = *(GLfloat *)((long)pBVar9->src + lVar30 + 4);
            GVar3 = *(GLfloat *)((long)pBVar9->src + lVar30 + 8);
            GVar4 = *(GLfloat *)((long)pBVar9->src + lVar30 + 0xc);
            local_368._4_4_ = GVar2;
            local_368._0_4_ = GVar1;
            local_360 = GVar3;
            GStack_35c = GVar4;
            Blend((glcts *)&local_328,*(GLenum *)((long)pBVar9->src + lVar30 + -4),(Vec4 *)local_368
                  ,(Vec4 *)&local_348);
            local_348 = local_328._M_dataplus._M_p;
            uStack_340 = local_328._M_string_length;
            (*pFVar20->blendEquation)(*(GLenum *)((long)pBVar9->src + lVar30 + -4));
            GVar16 = (*pFVar20->getError)();
            glu::checkError(GVar16,"BlendEquation failed",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/common/glcBlendEquationAdvancedTests.cpp"
                            ,0x2c6);
            p_Var10 = pFVar20->uniform4f;
            GVar17 = (*pFVar20->getUniformLocation)(local_100.m_program.m_program,"uSrcCol");
            (*p_Var10)(GVar17,GVar1,GVar2,GVar3,GVar4);
            GVar16 = (*pFVar20->getError)();
            glu::checkError(GVar16,"Uniforms failed",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/common/glcBlendEquationAdvancedTests.cpp"
                            ,0x2ca);
            local_280 = (undefined1  [8])0x600000000;
            local_278._0_4_ = 1;
            local_278._8_8_ = s_indices;
            glu::draw(((local_370->super_TestCase).m_context)->m_renderCtx,
                      local_100.m_program.m_program,1,(VertexArrayBinding *)local_308,
                      (PrimitiveList *)local_280,(DrawUtilCallback *)0x0);
            GVar16 = (*pFVar20->getError)();
            glu::checkError(GVar16,"Draw failed",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/common/glcBlendEquationAdvancedTests.cpp"
                            ,0x2cf);
            if (local_388 == local_380) {
              (*pFVar20->blendBarrier)();
            }
            lVar41 = lVar41 + 1;
            lVar30 = lVar30 + 0x14;
            pCVar28 = local_370;
          } while (lVar41 < local_370->m_numSteps);
        }
        uVar18 = (int)local_378 + 1;
        uVar23 = (ulong)uVar18;
      } while ((int)uVar18 < pCVar28->m_repeatCount);
    }
    pbVar24 = (byte *)operator_new__(0x400000);
    (*pFVar20->readPixels)(0,0,0x400,0x400,0x1908,0x1401,pbVar24);
    GVar16 = (*pFVar20->getError)();
    glu::checkError(GVar16,"Read pixels failed",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/common/glcBlendEquationAdvancedTests.cpp"
                    ,0x2d9);
    uVar18 = (uint)*pbVar24;
    bVar5 = pbVar24[1];
    bVar6 = pbVar24[2];
    bVar7 = pbVar24[3];
    tcu::RGBA::RGBA((RGBA *)local_280,(Vec4 *)&local_348);
    uVar43 = (uint)bVar5;
    uVar40 = (uint)bVar6;
    cVar33 = (char)*(int *)(local_338 + 8);
    if (*(int *)(local_338 + 8) == 1) {
      local_39c = (uint)(int)local_280[0] >> 7 & 0xff;
    }
    else {
      uVar29 = (local_280._0_4_ & 0xff) >> (8U - cVar33 & 0x1f);
      local_39c = uVar29 >> (cVar33 * '\x02' - 8U & 0x1f) | uVar29 << (8U - cVar33 & 0x1f);
    }
    uVar29 = (uint)bVar7;
    local_388 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                CONCAT44(local_388._4_4_,uVar29);
    cVar34 = (char)*(int *)(local_338 + 0xc);
    if (*(int *)(local_338 + 0xc) == 1) {
      uVar39 = (uint)(int)local_280._0_2_ >> 0xf & 0xff;
    }
    else {
      uVar39 = ((uint)local_280._0_4_ >> 8 & 0xff) >> (8U - cVar34 & 0x1f);
      uVar39 = uVar39 >> (cVar34 * '\x02' - 8U & 0x1f) | uVar39 << (8U - cVar34 & 0x1f);
    }
    cVar37 = (char)*(int *)(local_338 + 0x10);
    if (*(int *)(local_338 + 0x10) == 1) {
      uVar31 = (int)(local_280._0_4_ << 8) >> 0x1f & 0xff;
    }
    else {
      uVar31 = ((uint)local_280._0_4_ >> 0x10 & 0xff) >> (8U - cVar37 & 0x1f);
      uVar31 = uVar31 >> (cVar37 * '\x02' - 8U & 0x1f) | uVar31 << (8U - cVar37 & 0x1f);
    }
    iVar14 = *(int *)(local_338 + 0x14);
    uVar26 = 0xff;
    cVar38 = (char)iVar14;
    if (iVar14 != 0) {
      if (iVar14 == 1) {
        uVar26 = (int)local_280._0_4_ >> 0x1f & 0xff;
      }
      else {
        uVar26 = ((uint)local_280._0_4_ >> 0x18) >> (8U - cVar38 & 0x1f);
        uVar26 = uVar26 >> (cVar38 * '\x02' - 8U & 0x1f) | uVar26 << (8U - cVar38 & 0x1f);
      }
    }
    uVar19 = uVar39 << 8 | local_39c;
    local_380 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                CONCAT44(local_380._4_4_,uVar19);
    uVar31 = uVar31 << 0x10 | uVar26 << 0x18 | uVar19;
    uVar39 = 0;
    if (0 < iVar14) {
      uVar39 = 0x1000000 << (8U - cVar38 & 0x1f);
    }
    uVar32 = 0x100 << (8U - cVar34 & 0x1f) | 1 << ((byte)(8U - cVar33) & 0x1f);
    uVar39 = 0x10000 << (8U - cVar37 & 0x1f) | uVar32 | uVar39;
    uVar26 = 2 << (8U - cVar33 & 0x1f) & 0x1fe;
    if (0xfe < uVar26) {
      uVar26 = 0xff;
    }
    uVar32 = uVar32 >> 7 & 0x1fe;
    if (0xfe < uVar32) {
      uVar32 = 0xff;
    }
    uVar42 = uVar39 >> 0xf & 0x1fe;
    if (0xfe < uVar42) {
      uVar42 = 0xff;
    }
    uVar39 = uVar39 >> 0x17 & 0xfffffffe;
    if (0xfe < uVar39) {
      uVar39 = 0xff;
    }
    bVar44 = true;
    bVar13 = true;
    local_378 = CONCAT44(local_378._4_4_,uVar31);
    if (uVar31 != (uVar43 << 8 | (uint)bVar6 << 0x10 | uVar29 << 0x18) + uVar18) {
      uVar27 = (local_39c & 0xff) - uVar18;
      uVar11 = -uVar27;
      if (0 < (int)uVar27) {
        uVar11 = uVar27;
      }
      iVar15 = (uVar19 >> 8 & 0xff) - uVar43;
      iVar14 = -iVar15;
      if (0 < iVar15) {
        iVar14 = iVar15;
      }
      iVar35 = (uVar31 >> 0x10 & 0xff) - uVar40;
      iVar15 = -iVar35;
      if (0 < iVar35) {
        iVar15 = iVar35;
      }
      iVar36 = (uVar31 >> 0x18) - uVar29;
      iVar35 = -iVar36;
      if (0 < iVar36) {
        iVar35 = iVar36;
      }
      local_280._0_4_ = iVar15 << 0x10 | iVar14 << 8 | uVar11 | iVar35 << 0x18;
      bVar13 = tcu::RGBA::isBelowThreshold
                         ((RGBA *)local_280,
                          (RGBA)(uVar42 << 0x10 | uVar26 | uVar32 << 8 | uVar39 << 0x18));
    }
    lVar30 = 0;
    do {
      if (bVar44) {
        bVar44 = *(int *)pbVar24 == *(int *)(pbVar24 + lVar30);
      }
      else {
        bVar44 = false;
      }
      lVar30 = lVar30 + 4;
    } while (lVar30 != 0x3ff000);
    local_338 = CONCAT71(local_338._1_7_,bVar13 & bVar44);
    if ((bVar13 & bVar44) == 0) {
      local_280 = (undefined1  [8])local_330;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_278);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_278,"Exceeds: ",9);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_278,"RGBA(",5);
      poVar25 = (ostream *)std::ostream::operator<<(local_278,uVar26);
      std::__ostream_insert<char,std::char_traits<char>>(poVar25,", ",2);
      poVar25 = (ostream *)std::ostream::operator<<(poVar25,uVar32);
      std::__ostream_insert<char,std::char_traits<char>>(poVar25,", ",2);
      poVar25 = (ostream *)std::ostream::operator<<(poVar25,uVar42);
      std::__ostream_insert<char,std::char_traits<char>>(poVar25,", ",2);
      poVar25 = (ostream *)std::ostream::operator<<(poVar25,uVar39);
      std::__ostream_insert<char,std::char_traits<char>>(poVar25,")",1);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_278," diff:",6);
      uVar39 = (local_39c & 0xff) - uVar18;
      uVar29 = -uVar39;
      if (0 < (int)uVar39) {
        uVar29 = uVar39;
      }
      iVar15 = ((uint)local_380 >> 8 & 0xff) - uVar43;
      iVar14 = -iVar15;
      if (0 < iVar15) {
        iVar14 = iVar15;
      }
      iVar35 = ((uint)local_378 >> 0x10 & 0xff) - uVar40;
      iVar15 = -iVar35;
      if (0 < iVar35) {
        iVar15 = iVar35;
      }
      iVar36 = ((uint)local_378 >> 0x18) - (int)local_388;
      iVar35 = -iVar36;
      if (0 < iVar36) {
        iVar35 = iVar36;
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_278,"RGBA(",5);
      poVar25 = (ostream *)std::ostream::operator<<(local_278,uVar29 & 0xff);
      std::__ostream_insert<char,std::char_traits<char>>(poVar25,", ",2);
      uVar29 = iVar15 << 0x10 | uVar29 | iVar14 << 8 | iVar35 << 0x18;
      poVar25 = (ostream *)std::ostream::operator<<(poVar25,uVar29 >> 8 & 0xff);
      std::__ostream_insert<char,std::char_traits<char>>(poVar25,", ",2);
      poVar25 = (ostream *)std::ostream::operator<<(poVar25,uVar29 >> 0x10 & 0xff);
      std::__ostream_insert<char,std::char_traits<char>>(poVar25,", ",2);
      poVar25 = (ostream *)std::ostream::operator<<(poVar25,uVar29 >> 0x18);
      std::__ostream_insert<char,std::char_traits<char>>(poVar25,")",1);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_278,"  res:",6);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_278,"RGBA(",5);
      poVar25 = (ostream *)std::ostream::operator<<(local_278,uVar18);
      std::__ostream_insert<char,std::char_traits<char>>(poVar25,", ",2);
      poVar25 = (ostream *)std::ostream::operator<<(poVar25,uVar43);
      std::__ostream_insert<char,std::char_traits<char>>(poVar25,", ",2);
      poVar25 = (ostream *)std::ostream::operator<<(poVar25,uVar40);
      std::__ostream_insert<char,std::char_traits<char>>(poVar25,", ",2);
      poVar25 = (ostream *)std::ostream::operator<<(poVar25,(int)local_388);
      std::__ostream_insert<char,std::char_traits<char>>(poVar25,")",1);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_278,"  ref:",6);
      tcu::RGBA::RGBA((RGBA *)local_368,(Vec4 *)&local_348);
      uVar12 = local_368._0_4_;
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_278,"RGBA(",5);
      poVar25 = (ostream *)std::ostream::operator<<((ostringstream *)local_278,uVar12 & 0xff);
      std::__ostream_insert<char,std::char_traits<char>>(poVar25,", ",2);
      poVar25 = (ostream *)std::ostream::operator<<(poVar25,(uint)uVar12 >> 8 & 0xff);
      std::__ostream_insert<char,std::char_traits<char>>(poVar25,", ",2);
      poVar25 = (ostream *)std::ostream::operator<<(poVar25,(uint)uVar12 >> 0x10 & 0xff);
      std::__ostream_insert<char,std::char_traits<char>>(poVar25,", ",2);
      poVar25 = (ostream *)std::ostream::operator<<(poVar25,(uint)uVar12 >> 0x18);
      std::__ostream_insert<char,std::char_traits<char>>(poVar25,")",1);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_280,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_278);
      std::ios_base::~ios_base(local_208);
      pcVar22 = "Fail (results differ)";
    }
    else {
      pcVar22 = "Pass";
    }
    operator_delete__(pbVar24);
    tcu::TestContext::setTestResult
              ((local_370->super_TestCase).super_TestCase.super_TestNode.m_testCtx,
               (uint)((byte)local_338 ^ 1),pcVar22);
    if (local_300._M_p != local_2f8 + 8) {
      operator_delete(local_300._M_p,local_2f8._8_8_ + 1);
    }
    glu::ShaderProgram::~ShaderProgram(&local_100);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2b8._M_dataplus._M_p != &local_2b8.field_2) {
      operator_delete(local_2b8._M_dataplus._M_p,local_2b8.field_2._M_allocated_capacity + 1);
    }
    FBOSentry::~FBOSentry(&local_298);
  }
  return STOP;
}

Assistant:

CoherentBlendTestCaseGroup::CoherentBlendTest::IterateResult CoherentBlendTestCaseGroup::CoherentBlendTest::iterate(
	void)
{
	static const int		 dim = 1024;
	const tcu::RenderTarget& rt  = m_context.getRenderContext().getRenderTarget();
	const tcu::PixelFormat&  pf  = rt.getPixelFormat();
	const glw::Functions&	gl  = m_context.getRenderContext().getFunctions();
	TestLog&				 log = m_testCtx.getLog();

	// Check that extension is supported.
	if (!IsExtensionSupported(m_context, "GL_KHR_blend_equation_advanced"))
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_NOT_SUPPORTED, "GL_KHR_blend_equation_advanced");
		return STOP;
	}

	bool needBarrier = !IsExtensionSupported(m_context, "GL_KHR_blend_equation_advanced_coherent");

	tcu::Vec4 dstCol(0.f, 0.f, 0.f, 0.f);

	FBOSentry fbo(gl, dim, dim, GL_RGBA8);

	// Setup progra
	std::string frgSrc = GetSolidShader("blend_support_all_equations", glu::getGLSLVersionDeclaration(m_glslVersion));
	glu::ShaderProgram p(m_context.getRenderContext(),
						 glu::makeVtxFragSources(GetDef2DVtxSrc(m_glslVersion).c_str(), frgSrc.c_str()));
	if (!p.isOk())
	{
		log << p;
		TCU_FAIL("Compile failed");
	}
	gl.useProgram(p.getProgram());
	GLU_EXPECT_NO_ERROR(gl.getError(), "Program failed");

	glu::VertexArrayBinding posBinding = glu::va::Float("aPos", 2, 4, 0, &s_pos[0]);

	// Enable blending.
	gl.disable(GL_DITHER);
	gl.enable(GL_BLEND);

	// Clear.
	gl.clearColor(dstCol[0], dstCol[1], dstCol[2], dstCol[3]);
	gl.clear(GL_COLOR_BUFFER_BIT);

	// Blend barrier.
	if (needBarrier)
		gl.blendBarrier();

	// Repeat block.
	for (int i = 0; i < m_repeatCount; i++)
		// Loop blending steps.
		for (int j = 0; j < m_numSteps; j++)
		{
			const BlendStep& s = m_steps[j];
			tcu::Vec4		 srcCol(s.src[0], s.src[1], s.src[2], s.src[3]);
			tcu::Vec4		 refCol = Blend(s.mode, srcCol, dstCol);
			dstCol					= refCol;

			// Set blend equation.
			gl.blendEquation(s.mode);
			GLU_EXPECT_NO_ERROR(gl.getError(), "BlendEquation failed");

			// Set source color.
			gl.uniform4f(gl.getUniformLocation(p.getProgram(), "uSrcCol"), srcCol[0], srcCol[1], srcCol[2], srcCol[3]);
			GLU_EXPECT_NO_ERROR(gl.getError(), "Uniforms failed");

			// Draw.
			glu::draw(m_context.getRenderContext(), p.getProgram(), 1, &posBinding,
					  glu::pr::Triangles(DE_LENGTH_OF_ARRAY(s_indices), &s_indices[0]));
			GLU_EXPECT_NO_ERROR(gl.getError(), "Draw failed");

			// Blend barrier.
			if (needBarrier)
				gl.blendBarrier();
		}

	// Read the results.
	glw::GLubyte* result = new glw::GLubyte[4 * dim * dim];
	gl.readPixels(0, 0, dim, dim, GL_RGBA, GL_UNSIGNED_BYTE, result);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Read pixels failed");

	// Check that first pixel is ok.
	tcu::RGBA res		= tcu::RGBA::fromBytes(result);
	tcu::RGBA ref		= pf.convertColor(tcu::RGBA(dstCol));
	tcu::RGBA threshold = pf.getColorThreshold() + pf.getColorThreshold();
	bool	  firstOk   = tcu::compareThreshold(ref, res, threshold);

	// Check that all pixels are the same as the first one.
	bool allSame = true;
	for (int i = 0; i < dim * (dim - 1); i++)
		allSame = allSame && (0 == memcmp(result, result + (i * 4), 4));

	bool pass = firstOk && allSame;
	if (!pass)
	{
		log << TestLog::Message << "Exceeds: " << threshold << " diff:" << tcu::computeAbsDiff(ref, res)
			<< "  res:" << res << "  ref:" << tcu::RGBA(dstCol) << TestLog::EndMessage;
	}

	delete[] result;

	m_testCtx.setTestResult(pass ? QP_TEST_RESULT_PASS : QP_TEST_RESULT_FAIL, pass ? "Pass" : "Fail (results differ)");
	return STOP;
}